

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

void Abc_DesCleanManPointer(Abc_Des_t *p,void *pMan)

{
  void **ppvVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  
  if (p != (Abc_Des_t *)0x0) {
    if (p->pManFunc == pMan) {
      p->pManFunc = (void *)0x0;
    }
    lVar3 = (long)p->vModules->nSize;
    if (0 < lVar3) {
      ppvVar1 = p->vModules->pArray;
      lVar4 = 0;
      do {
        pvVar2 = ppvVar1[lVar4];
        if (*(void **)((long)pvVar2 + 0x100) == pMan) {
          *(undefined8 *)((long)pvVar2 + 0x100) = 0;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
  }
  return;
}

Assistant:

void Abc_DesCleanManPointer( Abc_Des_t * p, void * pMan )
{
    Abc_Ntk_t * pTemp;
    int i;
    if ( p == NULL )
        return;
    if ( p->pManFunc == pMan )
        p->pManFunc = NULL;
    Vec_PtrForEachEntry( Abc_Ntk_t *, p->vModules, pTemp, i )
        if ( pTemp->pManFunc == pMan )
            pTemp->pManFunc = NULL;
}